

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::checkmesh(tetgenmesh *this,int topoflag)

{
  int iVar1;
  tetrahedron pa;
  tetrahedron pb;
  tetrahedron pc;
  tetrahedron pd;
  ulong uVar2;
  uint uVar3;
  tetrahedron *pppdVar4;
  long lVar5;
  char *pcVar6;
  tetrahedron *pppdVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  uint local_7c;
  ulong local_50;
  int (*local_40) [12];
  
  if (this->b->quiet == 0) {
    puts("  Checking consistency of mesh...");
  }
  memorypool::traversalinit(this->tetrahedrons);
  pppdVar4 = alltetrahedrontraverse(this);
  local_7c = 0;
  do {
    if (pppdVar4 == (tetrahedron *)0x0) {
      if (local_7c == 0) {
        if (this->b->quiet == 0) {
          puts("  In my studied opinion, the mesh appears to be consistent.");
        }
      }
      else {
        pcVar6 = "abnormities";
        if (1 < (int)local_7c) {
          pcVar6 = "abnormity";
        }
        printf("  !! !! !! !! %d %s witnessed.\n",(ulong)local_7c,pcVar6);
      }
      return local_7c;
    }
    local_40 = fsymtbl;
    local_50 = 0;
    for (lVar9 = -0x10; lVar9 != 0; lVar9 = lVar9 + 4) {
      pa = pppdVar4[*(int *)((long)orgpivot + lVar9 + 0x10)];
      pb = pppdVar4[*(int *)((long)destpivot + lVar9 + 0x10)];
      pc = pppdVar4[*(int *)((long)apexpivot + lVar9 + 0x10)];
      pd = pppdVar4[*(int *)((long)oppopivot + lVar9 + 0x10)];
      if (lVar9 == -0x10) {
        if (((topoflag == 0) && (pppdVar4[7] != (tetrahedron)this->dummypoint)) &&
           (dVar10 = orient3d((double *)pa,(double *)pb,(double *)pc,(double *)pd), 0.0 <= dVar10))
        {
          pcVar6 = "Degenerated";
          if (0.0 < dVar10) {
            pcVar6 = "Inverted";
          }
          printf("  !! !! %s ",pcVar6);
          lVar5 = (long)this->pointmarkindex;
          printf("  (%d, %d, %d, %d) (ori = %.17g)\n",dVar10,(ulong)*(uint *)((long)pa + lVar5 * 4),
                 (ulong)*(uint *)((long)pb + lVar5 * 4),(ulong)*(uint *)((long)pc + lVar5 * 4),
                 (ulong)*(uint *)((long)pd + lVar5 * 4));
          local_7c = local_7c + 1;
        }
        uVar3 = *(uint *)((long)pppdVar4 + (long)this->elemmarkerindex * 4);
        if ((uVar3 & 1) != 0) {
          lVar5 = (long)this->pointmarkindex;
          printf("  !! (%d, %d, %d, %d) is infected.\n",(ulong)*(uint *)((long)pa + lVar5 * 4),
                 (ulong)*(uint *)((long)pb + lVar5 * 4),(ulong)*(uint *)((long)pc + lVar5 * 4),
                 (ulong)*(uint *)((long)pd + lVar5 * 4));
          local_7c = local_7c + 1;
          uVar3 = *(uint *)((long)pppdVar4 + (long)this->elemmarkerindex * 4);
        }
        if ((uVar3 & 2) != 0) {
          lVar5 = (long)this->pointmarkindex;
          printf("  !! (%d, %d, %d, %d) is marked.\n",(ulong)*(uint *)((long)pa + lVar5 * 4),
                 (ulong)*(uint *)((long)pb + lVar5 * 4),(ulong)*(uint *)((long)pc + lVar5 * 4),
                 (ulong)*(uint *)((long)pd + lVar5 * 4));
          local_7c = local_7c + 1;
        }
      }
      uVar2 = *(ulong *)((long)pppdVar4 + lVar9 * 2 + 0x20);
      if (uVar2 == 0) {
        lVar5 = (long)this->pointmarkindex;
        printf("  !! !! No neighbor at face (%d, %d, %d).\n",(ulong)*(uint *)((long)pa + lVar5 * 4),
               (ulong)*(uint *)((long)pb + lVar5 * 4),(ulong)*(uint *)((long)pc + lVar5 * 4));
LAB_0013f624:
        local_7c = local_7c + 1;
      }
      else {
        uVar8 = uVar2 & 0xfffffffffffffff0;
        if (uVar8 == 0) {
          lVar5 = (long)this->pointmarkindex;
          printf("  !! !! Tet-face has no neighbor (%d, %d, %d) - %d:\n",
                 (ulong)*(uint *)((long)pa + lVar5 * 4),(ulong)*(uint *)((long)pb + lVar5 * 4),
                 (ulong)*(uint *)((long)pc + lVar5 * 4),(ulong)*(uint *)((long)pd + lVar5 * 4));
          goto LAB_0013f624;
        }
        uVar3 = (*local_40)[(uint)uVar2 & 0xf];
        uVar2 = *(ulong *)(uVar8 + (ulong)(uVar3 & 3) * 8);
        pppdVar7 = (tetrahedron *)(uVar2 & 0xfffffffffffffff0);
        if ((pppdVar4 != pppdVar7) || (local_50 != (uint)fsymtbl[(int)uVar3][(uint)uVar2 & 0xf])) {
          puts("  !! !! Asymmetric tetra-tetra bond:");
          if (pppdVar4 == pppdVar7) {
            puts("   (Right tetrahedron, wrong orientation)");
          }
          lVar5 = (long)this->pointmarkindex;
          printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar5 * 4),
                 (ulong)*(uint *)((long)pb + lVar5 * 4),(ulong)*(uint *)((long)pc + lVar5 * 4),
                 (ulong)*(uint *)((long)pd + lVar5 * 4));
          lVar5 = (long)this->pointmarkindex;
          printf("    Second: (%d, %d, %d, %d)\n",
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)orgpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)destpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)apexpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)oppopivot[(int)uVar3] * 8) + lVar5 * 4));
          local_7c = local_7c + 1;
        }
        if ((*(tetrahedron *)(uVar8 + (long)orgpivot[(int)uVar3] * 8) != pb) ||
           (*(tetrahedron *)(uVar8 + (long)destpivot[(int)uVar3] * 8) != pa)) {
          puts("  !! !! Wrong edge-edge bond:");
          lVar5 = (long)this->pointmarkindex;
          printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar5 * 4),
                 (ulong)*(uint *)((long)pb + lVar5 * 4),(ulong)*(uint *)((long)pc + lVar5 * 4),
                 (ulong)*(uint *)((long)pd + lVar5 * 4));
          lVar5 = (long)this->pointmarkindex;
          printf("    Second: (%d, %d, %d, %d)\n",
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)orgpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)destpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)apexpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)oppopivot[(int)uVar3] * 8) + lVar5 * 4));
          local_7c = local_7c + 1;
        }
        if (*(tetrahedron *)(uVar8 + (long)apexpivot[(int)uVar3] * 8) != pc) {
          puts("  !! !! Wrong face-face bond:");
          lVar5 = (long)this->pointmarkindex;
          printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar5 * 4),
                 (ulong)*(uint *)((long)pb + lVar5 * 4),(ulong)*(uint *)((long)pc + lVar5 * 4),
                 (ulong)*(uint *)((long)pd + lVar5 * 4));
          lVar5 = (long)this->pointmarkindex;
          printf("    Second: (%d, %d, %d, %d)\n",
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)orgpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)destpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)apexpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)oppopivot[(int)uVar3] * 8) + lVar5 * 4));
          local_7c = local_7c + 1;
        }
        if (*(tetrahedron *)(uVar8 + (long)oppopivot[(int)uVar3] * 8) == pd) {
          puts("  !! !! Two identical tetra:");
          lVar5 = (long)this->pointmarkindex;
          printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar5 * 4),
                 (ulong)*(uint *)((long)pb + lVar5 * 4),(ulong)*(uint *)((long)pc + lVar5 * 4),
                 (ulong)*(uint *)((long)pd + lVar5 * 4));
          lVar5 = (long)this->pointmarkindex;
          printf("    Second: (%d, %d, %d, %d)\n",
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)orgpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)destpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)apexpivot[(int)uVar3] * 8) + lVar5 * 4),
                 (ulong)*(uint *)(*(long *)(uVar8 + (long)oppopivot[(int)uVar3] * 8) + lVar5 * 4));
          local_7c = local_7c + 1;
        }
      }
      if ((*(uint *)((long)pppdVar4 + (long)this->elemmarkerindex * 4) >> ((byte)local_50 & 0x1f) &
          4) != 0) {
        lVar5 = (long)this->pointmarkindex;
        printf("  !! tetface (%d, %d, %d) %d is marked.\n",(ulong)*(uint *)((long)pa + lVar5 * 4),
               (ulong)*(uint *)((long)pb + lVar5 * 4),(ulong)*(uint *)((long)pc + lVar5 * 4),
               (ulong)*(uint *)((long)pd + lVar5 * 4));
      }
      local_50 = local_50 + 1;
      local_40 = local_40 + 1;
    }
    for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 4) {
      iVar1 = *(int *)((long)edge2ver + lVar9);
      if ((*(uint *)((long)pppdVar4 + (long)this->elemmarkerindex * 4) >>
           (*(byte *)(ver2edge + iVar1) & 0x1f) & 0x40) != 0) {
        lVar5 = (long)this->pointmarkindex;
        printf("  !! tetedge (%d, %d) %d, %d is marked.\n",
               (ulong)*(uint *)((long)pppdVar4[orgpivot[iVar1]] + lVar5 * 4),
               (ulong)*(uint *)((long)pppdVar4[destpivot[iVar1]] + lVar5 * 4),
               (ulong)*(uint *)((long)pppdVar4[apexpivot[iVar1]] + lVar5 * 4),
               (ulong)*(uint *)((long)pppdVar4[oppopivot[iVar1]] + lVar5 * 4));
      }
    }
    pppdVar4 = alltetrahedrontraverse(this);
  } while( true );
}

Assistant:

int tetgenmesh::checkmesh(int topoflag)
{
  triface tetloop, neightet, symtet;
  point pa, pb, pc, pd;
  REAL ori;
  int horrors, i;

  if (!b->quiet) {
    printf("  Checking consistency of mesh...\n");
  }

  horrors = 0;
  tetloop.ver = 0;
  // Run through the list of tetrahedra, checking each one.
  tetrahedrons->traversalinit();
  tetloop.tet = alltetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Check all four faces of the tetrahedron.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      pa = org(tetloop);
      pb = dest(tetloop);
      pc = apex(tetloop);
      pd = oppo(tetloop);
      if (tetloop.ver == 0) {  // Only test for inversion once.
        if (!ishulltet(tetloop)) {  // Only do test if it is not a hull tet.
          if (!topoflag) {
            ori = orient3d(pa, pb, pc, pd);
            if (ori >= 0.0) {
              printf("  !! !! %s ", ori > 0.0 ? "Inverted" : "Degenerated");
              printf("  (%d, %d, %d, %d) (ori = %.17g)\n", pointmark(pa),
                     pointmark(pb), pointmark(pc), pointmark(pd), ori);
              horrors++;
            }
          }
        }
        if (infected(tetloop)) { 
          // This may be a bug. Report it.
          printf("  !! (%d, %d, %d, %d) is infected.\n", pointmark(pa),
                 pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
        if (marktested(tetloop)) {
          // This may be a bug. Report it.
          printf("  !! (%d, %d, %d, %d) is marked.\n", pointmark(pa),
                 pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
      }
      if (tetloop.tet[tetloop.ver] == NULL) {
        printf("  !! !! No neighbor at face (%d, %d, %d).\n", pointmark(pa),
               pointmark(pb), pointmark(pc));
        horrors++;
      } else {
        // Find the neighboring tetrahedron on this face.
        fsym(tetloop, neightet);
        if (neightet.tet != NULL) {
          // Check that the tetrahedron's neighbor knows it's a neighbor.
          fsym(neightet, symtet);
          if ((tetloop.tet != symtet.tet) || (tetloop.ver != symtet.ver)) {
            printf("  !! !! Asymmetric tetra-tetra bond:\n");
            if (tetloop.tet == symtet.tet) {
              printf("   (Right tetrahedron, wrong orientation)\n");
            }
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same edge (the bond() operation).
          if ((org(neightet) != pb) || (dest(neightet) != pa)) {
            printf("  !! !! Wrong edge-edge bond:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same apex.
          if (apex(neightet) != pc) {
            printf("  !! !! Wrong face-face bond:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same opposite.
          if (oppo(neightet) == pd) {
            printf("  !! !! Two identical tetra:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
        } else {
          printf("  !! !! Tet-face has no neighbor (%d, %d, %d) - %d:\n",
                 pointmark(pa), pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
      }
      if (facemarked(tetloop)) {
        // This may be a bug. Report it.
        printf("  !! tetface (%d, %d, %d) %d is marked.\n", pointmark(pa),
               pointmark(pb), pointmark(pc), pointmark(pd));
      }
    }
    // Check the six edges of this tet.
    for (i = 0; i < 6; i++) {
      tetloop.ver = edge2ver[i];
      if (edgemarked(tetloop)) {
        // This may be a bug. Report it.
        printf("  !! tetedge (%d, %d) %d, %d is marked.\n", 
               pointmark(org(tetloop)), pointmark(dest(tetloop)), 
               pointmark(apex(tetloop)), pointmark(oppo(tetloop)));
      }
    }
    tetloop.tet = alltetrahedrontraverse();
  }
  if (horrors == 0) {
    if (!b->quiet) {
      printf("  In my studied opinion, the mesh appears to be consistent.\n");
    }
  } else {
    printf("  !! !! !! !! %d %s witnessed.\n", horrors, 
           horrors > 1 ? "abnormity" : "abnormities");
  }

  return horrors;
}